

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall QTextHtmlExporter::emitBlockAttributes(QTextHtmlExporter *this,QTextBlock *block)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  QLatin1StringView s_04;
  QLatin1StringView s_05;
  QLatin1StringView s_06;
  QLatin1StringView s_07;
  QLatin1StringView s_08;
  QLatin1StringView s_09;
  QLatin1StringView s_10;
  bool bVar1;
  LayoutDirection LVar2;
  int iVar3;
  QFlagsStorage<QTextFormat::PageBreakFlag> policy;
  BrushStyle BVar4;
  QTextFormat *in_RDI;
  long in_FS_OFFSET;
  qreal qVar5;
  bool emptyBlock;
  QBrush bg;
  QLatin1StringView style;
  QTextHtmlExporter *in_stack_00000248;
  QTextCharFormat blockCharFmt;
  QTextCharFormat diff;
  QTextBlockFormat format;
  undefined4 in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  uint uVar6;
  QTextFormat *in_stack_fffffffffffffd30;
  QLatin1String *in_stack_fffffffffffffd38;
  QChar c;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  QTextFormat *this_00;
  QTextHtmlExporter *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  QTextHtmlExporter *in_stack_fffffffffffffd60;
  QTextBlock *local_290;
  undefined1 in_stack_fffffffffffffdb0 [16];
  undefined1 in_stack_fffffffffffffdc0 [16];
  QTextHtmlExporter *in_stack_fffffffffffffdd0;
  QChar local_1ca [5];
  undefined1 *local_1c0;
  QLatin1String local_1b8;
  QLatin1StringView local_1a0;
  QTextFormat local_190 [2];
  QChar local_162;
  undefined1 local_160 [24];
  undefined1 local_148 [30];
  QChar local_12a;
  undefined1 local_128 [24];
  undefined1 local_110 [24];
  undefined1 local_f8 [24];
  undefined1 local_e0 [24];
  undefined1 local_c8 [24];
  qsizetype local_b0;
  char *local_a8;
  QLatin1StringView local_a0;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  iterator local_50;
  undefined1 local_38 [16];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::blockFormat
            ((QTextBlock *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  QTextBlockFormat::alignment((QTextBlockFormat *)in_stack_fffffffffffffd30);
  emitAlignment(in_stack_fffffffffffffd60,
                (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)local_290 >> 0x20,0));
  LVar2 = QTextBlock::textDirection(local_290);
  if (LVar2 == RightToLeft) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
    s.m_size._4_4_ = in_stack_fffffffffffffd44;
    s.m_size._0_4_ = in_stack_fffffffffffffd40;
    s.m_data = (char *)in_stack_fffffffffffffd48;
    QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),s);
  }
  local_a0.m_data = &DAT_aaaaaaaaaaaaaaaa;
  local_a0.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a0 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
  local_b0 = local_a0.m_size;
  local_a8 = local_a0.m_data;
  s_00.m_size._4_4_ = in_stack_fffffffffffffd44;
  s_00.m_size._0_4_ = in_stack_fffffffffffffd40;
  s_00.m_data = (char *)in_stack_fffffffffffffd48;
  QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),s_00)
  ;
  QTextBlock::begin((QTextBlock *)in_RDI);
  bVar1 = QTextBlock::iterator::atEnd(&local_50);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
    s_01.m_size._4_4_ = in_stack_fffffffffffffd44;
    s_01.m_size._0_4_ = in_stack_fffffffffffffd40;
    s_01.m_data = (char *)in_stack_fffffffffffffd48;
    QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                        s_01);
  }
  qVar5 = QTextBlockFormat::topMargin((QTextBlockFormat *)0x7b6cf4);
  QString::number(qVar5,(char)local_c8,0x67);
  qVar5 = QTextBlockFormat::bottomMargin((QTextBlockFormat *)0x7b6d18);
  QString::number(qVar5,(char)local_e0,0x67);
  qVar5 = QTextBlockFormat::leftMargin((QTextBlockFormat *)0x7b6d3c);
  QString::number(qVar5,(char)local_f8,0x67);
  qVar5 = QTextBlockFormat::rightMargin((QTextBlockFormat *)0x7b6d60);
  QString::number(qVar5,(char)local_110,0x67);
  emitMargins(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc0._8_8_,
              in_stack_fffffffffffffdc0._0_8_,in_stack_fffffffffffffdb0._8_8_,
              in_stack_fffffffffffffdb0._0_8_);
  QString::~QString((QString *)0x7b6dae);
  QString::~QString((QString *)0x7b6dbb);
  QString::~QString((QString *)0x7b6dc8);
  QString::~QString((QString *)0x7b6dd5);
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
  s_02.m_size._4_4_ = in_stack_fffffffffffffd44;
  s_02.m_size._0_4_ = in_stack_fffffffffffffd40;
  s_02.m_data = (char *)in_stack_fffffffffffffd48;
  QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),s_02)
  ;
  iVar3 = QTextBlockFormat::indent((QTextBlockFormat *)0x7b6e1d);
  QString::number((int)local_128,iVar3);
  QString::operator+=((QString *)in_stack_fffffffffffffd30,
                      (QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  QString::~QString((QString *)0x7b6e50);
  QChar::QChar<char16_t,_true>(&local_12a,L';');
  QString::operator+=((QString *)in_stack_fffffffffffffd30,
                      (QChar)(char16_t)((ulong)in_stack_fffffffffffffd38 >> 0x30));
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
  s_03.m_size._4_4_ = in_stack_fffffffffffffd44;
  s_03.m_size._0_4_ = in_stack_fffffffffffffd40;
  s_03.m_data = (char *)in_stack_fffffffffffffd48;
  QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),s_03)
  ;
  qVar5 = QTextBlockFormat::textIndent((QTextBlockFormat *)0x7b6ebc);
  QString::number(qVar5,(char)local_148,0x67);
  QString::operator+=((QString *)in_stack_fffffffffffffd30,
                      (QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  QString::~QString((QString *)0x7b6ef2);
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
  s_04.m_size._4_4_ = in_stack_fffffffffffffd44;
  s_04.m_size._0_4_ = in_stack_fffffffffffffd40;
  s_04.m_data = (char *)in_stack_fffffffffffffd48;
  QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),s_04)
  ;
  iVar3 = QTextBlock::userState((QTextBlock *)in_stack_fffffffffffffd38);
  if (iVar3 != -1) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
    s_05.m_size._4_4_ = in_stack_fffffffffffffd44;
    s_05.m_size._0_4_ = in_stack_fffffffffffffd40;
    s_05.m_data = (char *)in_stack_fffffffffffffd48;
    QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                        s_05);
    iVar3 = QTextBlock::userState((QTextBlock *)in_stack_fffffffffffffd38);
    QString::number((int)local_160,iVar3);
    QString::operator+=((QString *)in_stack_fffffffffffffd30,
                        (QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    QString::~QString((QString *)0x7b6fbe);
    QChar::QChar<char16_t,_true>(&local_162,L';');
    QString::operator+=((QString *)in_stack_fffffffffffffd30,
                        (QChar)(char16_t)((ulong)in_stack_fffffffffffffd38 >> 0x30));
  }
  iVar3 = QTextBlockFormat::lineHeightType((QTextBlockFormat *)0x7b6fef);
  this_00 = (QTextFormat *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40);
  if (iVar3 != 0) {
    local_1a0 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
    this_00 = (QTextFormat *)local_38;
    qVar5 = QTextBlockFormat::lineHeight((QTextBlockFormat *)0x7b702b);
    in_stack_fffffffffffffd38 = &local_1b8;
    QString::number(qVar5,(char)in_stack_fffffffffffffd38,0x67);
    in_stack_fffffffffffffd30 = local_190;
    ::operator+(in_stack_fffffffffffffd38,(QString *)in_stack_fffffffffffffd30);
    ::operator+=(&in_stack_fffffffffffffd60->html,
                 (QStringBuilder<QLatin1String,_QString> *)
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    QStringBuilder<QLatin1String,_QString>::~QStringBuilder
              ((QStringBuilder<QLatin1String,_QString> *)0x7b707f);
    QString::~QString((QString *)0x7b7089);
    iVar3 = QTextBlockFormat::lineHeightType((QTextBlockFormat *)0x7b7093);
    in_stack_fffffffffffffd48 = (QTextHtmlExporter *)(ulong)(iVar3 - 1);
    switch(in_stack_fffffffffffffd48) {
    case (QTextHtmlExporter *)0x0:
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
      s_06.m_data = (char *)in_stack_fffffffffffffd48;
      s_06.m_size = (qsizetype)this_00;
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                          s_06);
      break;
    case (QTextHtmlExporter *)0x1:
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
      s_07.m_data = (char *)in_stack_fffffffffffffd48;
      s_07.m_size = (qsizetype)this_00;
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                          s_07);
      break;
    case (QTextHtmlExporter *)0x2:
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
      s_08.m_data = (char *)in_stack_fffffffffffffd48;
      s_08.m_size = (qsizetype)this_00;
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                          s_08);
      break;
    case (QTextHtmlExporter *)0x3:
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
      s_09.m_data = (char *)in_stack_fffffffffffffd48;
      s_09.m_size = (qsizetype)this_00;
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                          s_09);
      break;
    default:
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
      s_10.m_data = (char *)in_stack_fffffffffffffd48;
      s_10.m_size = (qsizetype)this_00;
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                          s_10);
    }
  }
  policy.i = (Int)QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)in_stack_fffffffffffffd30);
  emitPageBreakPolicy(in_stack_fffffffffffffd48,(PageBreakFlags)policy.i);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)0x7b7206);
  if (bVar1) {
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::charFormat((QTextBlock *)this_00);
    formatDifference((QTextFormat *)CONCAT44(policy.i,in_stack_fffffffffffffd58),in_RDI);
    QTextFormat::toCharFormat
              ((QTextFormat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    QTextCharFormat::operator=
              ((QTextCharFormat *)in_stack_fffffffffffffd30,
               (QTextCharFormat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7b729c);
    QTextFormat::~QTextFormat((QTextFormat *)0x7b72a9);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7b72b6);
  }
  QTextFormat::clearProperty(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
  bVar1 = QTextFormat::hasProperty(this_00,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  if (bVar1) {
    local_1c0 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::background
              ((QTextFormat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    BVar4 = QBrush::style((QBrush *)0x7b7314);
    if (BVar4 != NoBrush) {
      QTextFormat::property((QTextFormat *)in_stack_fffffffffffffd48,(int)((ulong)this_00 >> 0x20));
      QTextFormat::setProperty
                (this_00,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                 (QVariant *)in_stack_fffffffffffffd30);
      ::QVariant::~QVariant(&local_28);
    }
    QBrush::~QBrush((QBrush *)0x7b7367);
  }
  c.ucs = (char16_t)((ulong)in_stack_fffffffffffffd38 >> 0x30);
  QTextFormat::properties((QTextFormat *)CONCAT44(policy.i,in_stack_fffffffffffffd58));
  bVar1 = QMap<int,_QVariant>::isEmpty((QMap<int,_QVariant> *)in_stack_fffffffffffffd30);
  uVar6 = (uint)bVar1 << 0x18 ^ 0xff000000;
  QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)0x7b739c);
  if ((uVar6 & 0x1000000) != 0) {
    emitCharFormatStyle(in_stack_00000248,(QTextCharFormat *)style.m_data);
  }
  QChar::QChar<char16_t,_true>(local_1ca,L'\"');
  QString::operator+=((QString *)in_stack_fffffffffffffd30,c);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7b73e9);
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7b73f6);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlExporter::emitBlockAttributes(const QTextBlock &block)
{
    QTextBlockFormat format = block.blockFormat();
    emitAlignment(format.alignment());

    // assume default to not bloat the html too much
    // html += " dir='ltr'"_L1;
    if (block.textDirection() == Qt::RightToLeft)
        html += " dir='rtl'"_L1;

    const auto style = " style=\""_L1;
    html += style;

    const bool emptyBlock = block.begin().atEnd();
    if (emptyBlock) {
        html += "-qt-paragraph-type:empty;"_L1;
    }

    emitMargins(QString::number(format.topMargin()),
                QString::number(format.bottomMargin()),
                QString::number(format.leftMargin()),
                QString::number(format.rightMargin()));

    html += " -qt-block-indent:"_L1;
    html += QString::number(format.indent());
    html += u';';

    html += " text-indent:"_L1;
    html += QString::number(format.textIndent());
    html += "px;"_L1;

    if (block.userState() != -1) {
        html += " -qt-user-state:"_L1;
        html += QString::number(block.userState());
        html += u';';
    }

    if (format.lineHeightType() != QTextBlockFormat::SingleHeight) {
        html += " line-height:"_L1
             + QString::number(format.lineHeight());
        switch (format.lineHeightType()) {
            case QTextBlockFormat::ProportionalHeight:
                html += "%;"_L1;
                break;
            case QTextBlockFormat::FixedHeight:
                html += "; -qt-line-height-type: fixed;"_L1;
                break;
            case QTextBlockFormat::MinimumHeight:
                html += "px;"_L1;
                break;
            case QTextBlockFormat::LineDistanceHeight:
                html += "; -qt-line-height-type: line-distance;"_L1;
                break;
            default:
                html += ";"_L1;
                break; // Should never reach here
        }
    }

    emitPageBreakPolicy(format.pageBreakPolicy());

    QTextCharFormat diff;
    if (emptyBlock) { // only print character properties when we don't expect them to be repeated by actual text in the parag
        const QTextCharFormat blockCharFmt = block.charFormat();
        diff = formatDifference(defaultCharFormat, blockCharFmt).toCharFormat();
    }

    diff.clearProperty(QTextFormat::BackgroundBrush);
    if (format.hasProperty(QTextFormat::BackgroundBrush)) {
        QBrush bg = format.background();
        if (bg.style() != Qt::NoBrush)
            diff.setProperty(QTextFormat::BackgroundBrush, format.property(QTextFormat::BackgroundBrush));
    }

    if (!diff.properties().isEmpty())
        emitCharFormatStyle(diff);

    html += u'"';

}